

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_SHA2_512.c
# Opt level: O3

void Hacl_SHA2_512_hash(uint8_t *hash1,uint8_t *input,uint32_t len)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [11];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  long lVar29;
  uint64_t *p12;
  uint8_t *puVar30;
  ulong uVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [11];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  uint64_t state [169];
  uint64_t local_578 [80];
  undefined1 local_2f8 [640];
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined1 auVar34 [15];
  
  memset(local_2f8,0,0x2c8);
  puVar30 = input + (len & 0xffffff80);
  local_578[0] = 0x428a2f98d728ae22;
  local_578[1] = 0x7137449123ef65cd;
  local_578[2] = 0xb5c0fbcfec4d3b2f;
  local_578[3] = 0xe9b5dba58189dbbc;
  local_578[4] = 0x3956c25bf348b538;
  local_578[5] = 0x59f111f1b605d019;
  local_578[6] = 0x923f82a4af194f9b;
  local_578[7] = 0xab1c5ed5da6d8118;
  local_578[8] = 0xd807aa98a3030242;
  local_578[9] = 0x12835b0145706fbe;
  local_578[10] = 0x243185be4ee4b28c;
  local_578[0xb] = 0x550c7dc3d5ffb4e2;
  local_578[0xc] = 0x72be5d74f27b896f;
  local_578[0xd] = 0x80deb1fe3b1696b1;
  local_578[0xe] = 0x9bdc06a725c71235;
  local_578[0xf] = 0xc19bf174cf692694;
  local_578[0x10] = 0xe49b69c19ef14ad2;
  local_578[0x11] = 0xefbe4786384f25e3;
  local_578[0x12] = 0xfc19dc68b8cd5b5;
  local_578[0x13] = 0x240ca1cc77ac9c65;
  local_578[0x14] = 0x2de92c6f592b0275;
  local_578[0x15] = 0x4a7484aa6ea6e483;
  local_578[0x16] = 0x5cb0a9dcbd41fbd4;
  local_578[0x17] = 0x76f988da831153b5;
  local_578[0x18] = 0x983e5152ee66dfab;
  local_578[0x19] = 0xa831c66d2db43210;
  local_578[0x1a] = 0xb00327c898fb213f;
  local_578[0x1b] = 0xbf597fc7beef0ee4;
  local_578[0x1c] = 0xc6e00bf33da88fc2;
  local_578[0x1d] = 0xd5a79147930aa725;
  local_578[0x1e] = 0x6ca6351e003826f;
  local_578[0x1f] = 0x142929670a0e6e70;
  local_578[0x20] = 0x27b70a8546d22ffc;
  local_578[0x21] = 0x2e1b21385c26c926;
  local_578[0x22] = 0x4d2c6dfc5ac42aed;
  local_578[0x23] = 0x53380d139d95b3df;
  local_578[0x24] = 0x650a73548baf63de;
  local_578[0x25] = 0x766a0abb3c77b2a8;
  local_578[0x26] = 0x81c2c92e47edaee6;
  local_578[0x27] = 0x92722c851482353b;
  local_578[0x28] = 0xa2bfe8a14cf10364;
  local_578[0x29] = 0xa81a664bbc423001;
  local_578[0x2a] = 0xc24b8b70d0f89791;
  local_578[0x2b] = 0xc76c51a30654be30;
  local_578[0x2c] = 0xd192e819d6ef5218;
  local_578[0x2d] = 0xd69906245565a910;
  local_578[0x2e] = 0xf40e35855771202a;
  local_578[0x2f] = 0x106aa07032bbd1b8;
  local_578[0x30] = 0x19a4c116b8d2d0c8;
  local_578[0x31] = 0x1e376c085141ab53;
  local_578[0x32] = 0x2748774cdf8eeb99;
  local_578[0x33] = 0x34b0bcb5e19b48a8;
  local_578[0x34] = 0x391c0cb3c5c95a63;
  local_578[0x35] = 0x4ed8aa4ae3418acb;
  local_578[0x36] = 0x5b9cca4f7763e373;
  local_578[0x37] = 0x682e6ff3d6b2b8a3;
  local_578[0x38] = 0x748f82ee5defb2fc;
  local_578[0x39] = 0x78a5636f43172f60;
  local_578[0x3a] = 0x84c87814a1f0ab72;
  local_578[0x3b] = 0x8cc702081a6439ec;
  local_578[0x3c] = 0x90befffa23631e28;
  local_578[0x3d] = 0xa4506cebde82bde9;
  local_578[0x3e] = 0xbef9a3f7b2c67915;
  local_578[0x3f] = 0xc67178f2e372532b;
  local_578[0x40] = 0xca273eceea26619c;
  local_578[0x41] = 0xd186b8c721c0c207;
  local_578[0x42] = 0xeada7dd6cde0eb1e;
  local_578[0x43] = 0xf57d4f7fee6ed178;
  local_578[0x44] = 0x6f067aa72176fba;
  local_578[0x45] = 0xa637dc5a2c898a6;
  local_578[0x46] = 0x113f9804bef90dae;
  local_578[0x47] = 0x1b710b35131c471b;
  local_578[0x48] = 0x28db77f523047d84;
  local_578[0x49] = 0x32caab7b40c72493;
  local_578[0x4a] = 0x3c9ebe0a15c9bebc;
  local_578[0x4b] = 0x431d67c49c100d4c;
  local_578[0x4c] = 0x4cc5d4becb3e42b6;
  local_578[0x4d] = 0x597f299cfc657e2a;
  local_578[0x4e] = 0x5fcb6fab3ad6faec;
  local_578[0x4f] = 0x6c44198c4a475817;
  local_78 = 0x6a09e667f3bcc908;
  local_70 = 0xbb67ae8584caa73b;
  local_68 = 0x3c6ef372fe94f82b;
  local_60 = 0xa54ff53a5f1d36f1;
  local_58 = 0x510e527fade682d1;
  local_50 = 0x9b05688c2b3e6c1f;
  local_48 = 0x1f83d9abfb41bd6b;
  local_40 = 0x5be0cd19137e2179;
  if (0x7f < len) {
    uVar31 = (ulong)(len >> 7);
    do {
      Hacl_Impl_SHA2_512_update(local_578,input);
      input = input + 0x80;
      uVar31 = uVar31 - 1;
    } while (uVar31 != 0);
  }
  Hacl_Impl_SHA2_512_update_last(local_578,puVar30,(ulong)(len & 0x7f));
  lVar29 = 0;
  do {
    auVar32 = *(undefined1 (*) [16])(&local_78 + lVar29);
    auVar36[8] = auVar32[8];
    auVar36[9] = 0;
    auVar36[10] = auVar32[9];
    auVar33._0_10_ = (unkuint10)auVar32[0xc] << 0x40;
    auVar33[10] = auVar32[0xd];
    auVar34[0xb] = 0;
    auVar34._0_11_ = auVar33;
    auVar34[0xc] = auVar32[0xe];
    auVar34[0xd] = 0;
    auVar34[0xe] = auVar32[0xf];
    auVar36[3] = 0;
    auVar36._0_3_ = auVar33._8_3_;
    auVar36._4_3_ = auVar34._12_3_;
    auVar36[7] = 0;
    auVar36[0xb] = 0;
    auVar36._12_3_ = (int3)(CONCAT16(auVar32[0xb],(uint6)auVar32[10] << 0x20) >> 0x20);
    auVar36[0xf] = 0;
    auVar35 = pshuflw(auVar36,auVar36,0x1b);
    auVar36 = pshufhw(auVar35,auVar35,0x1b);
    auVar17[0xd] = 0;
    auVar17._0_13_ = auVar32._0_13_;
    auVar17[0xe] = auVar32[7];
    auVar18[0xc] = auVar32[6];
    auVar18._0_12_ = auVar32._0_12_;
    auVar18._13_2_ = auVar17._13_2_;
    auVar19[0xb] = 0;
    auVar19._0_11_ = auVar32._0_11_;
    auVar19._12_3_ = auVar18._12_3_;
    auVar20[10] = auVar32[5];
    auVar20._0_10_ = auVar32._0_10_;
    auVar20._11_4_ = auVar19._11_4_;
    auVar21[9] = 0;
    auVar21._0_9_ = auVar32._0_9_;
    auVar21._10_5_ = auVar20._10_5_;
    auVar22[8] = auVar32[4];
    auVar22._0_8_ = auVar32._0_8_;
    auVar22._9_6_ = auVar21._9_6_;
    auVar35[7] = 0;
    auVar35._0_7_ = auVar22._8_7_;
    auVar25._7_8_ = 0;
    auVar25._0_7_ = auVar22._8_7_;
    auVar27._1_8_ = SUB158(auVar25 << 0x40,7);
    auVar27[0] = auVar32[3];
    auVar27._9_6_ = 0;
    auVar26._1_10_ = SUB1510(auVar27 << 0x30,5);
    auVar26[0] = auVar32[2];
    auVar28._11_4_ = 0;
    auVar28._0_11_ = auVar26;
    auVar23[2] = auVar32[1];
    auVar23._0_2_ = auVar32._0_2_;
    auVar23._3_12_ = SUB1512(auVar28 << 0x20,3);
    auVar24._2_13_ = auVar23._2_13_;
    auVar24._0_2_ = auVar32._0_2_ & 0xff;
    auVar35._8_4_ = auVar24._0_4_;
    auVar35._12_4_ = auVar26._0_4_;
    auVar32 = pshuflw(auVar35,auVar35,0x1b);
    auVar32 = pshufhw(auVar32,auVar32,0x1b);
    sVar1 = auVar32._0_2_;
    sVar2 = auVar32._2_2_;
    sVar3 = auVar32._4_2_;
    sVar4 = auVar32._6_2_;
    sVar5 = auVar32._8_2_;
    sVar6 = auVar32._10_2_;
    sVar7 = auVar32._12_2_;
    sVar8 = auVar32._14_2_;
    sVar9 = auVar36._0_2_;
    sVar10 = auVar36._2_2_;
    sVar11 = auVar36._4_2_;
    sVar12 = auVar36._6_2_;
    sVar13 = auVar36._8_2_;
    sVar14 = auVar36._10_2_;
    sVar15 = auVar36._12_2_;
    sVar16 = auVar36._14_2_;
    puVar30 = hash1 + lVar29 * 8;
    *puVar30 = (0 < sVar1) * (sVar1 < 0x100) * auVar32[0] - (0xff < sVar1);
    puVar30[1] = (0 < sVar2) * (sVar2 < 0x100) * auVar32[2] - (0xff < sVar2);
    puVar30[2] = (0 < sVar3) * (sVar3 < 0x100) * auVar32[4] - (0xff < sVar3);
    puVar30[3] = (0 < sVar4) * (sVar4 < 0x100) * auVar32[6] - (0xff < sVar4);
    puVar30[4] = (0 < sVar5) * (sVar5 < 0x100) * auVar32[8] - (0xff < sVar5);
    puVar30[5] = (0 < sVar6) * (sVar6 < 0x100) * auVar32[10] - (0xff < sVar6);
    puVar30[6] = (0 < sVar7) * (sVar7 < 0x100) * auVar32[0xc] - (0xff < sVar7);
    puVar30[7] = (0 < sVar8) * (sVar8 < 0x100) * auVar32[0xe] - (0xff < sVar8);
    puVar30[8] = (0 < sVar9) * (sVar9 < 0x100) * auVar36[0] - (0xff < sVar9);
    puVar30[9] = (0 < sVar10) * (sVar10 < 0x100) * auVar36[2] - (0xff < sVar10);
    puVar30[10] = (0 < sVar11) * (sVar11 < 0x100) * auVar36[4] - (0xff < sVar11);
    puVar30[0xb] = (0 < sVar12) * (sVar12 < 0x100) * auVar36[6] - (0xff < sVar12);
    puVar30[0xc] = (0 < sVar13) * (sVar13 < 0x100) * auVar36[8] - (0xff < sVar13);
    puVar30[0xd] = (0 < sVar14) * (sVar14 < 0x100) * auVar36[10] - (0xff < sVar14);
    puVar30[0xe] = (0 < sVar15) * (sVar15 < 0x100) * auVar36[0xc] - (0xff < sVar15);
    puVar30[0xf] = (0 < sVar16) * (sVar16 < 0x100) * auVar36[0xe] - (0xff < sVar16);
    lVar29 = lVar29 + 2;
  } while (lVar29 != 8);
  return;
}

Assistant:

void Hacl_SHA2_512_hash(uint8_t *hash1, uint8_t *input, uint32_t len)
{
  Hacl_Impl_SHA2_512_hash(hash1, input, len);
}